

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::LSTM_x86_avx::create_pipeline(LSTM_x86_avx *this,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  void *pvVar13;
  int *piVar14;
  Allocator *pAVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  void *pvVar25;
  long lVar26;
  void *pvVar27;
  long lVar28;
  void *pvVar29;
  void *pvVar30;
  ulong uVar31;
  void *pvVar32;
  void *pvVar33;
  long lVar34;
  uint _w;
  void *pvVar36;
  void *pvVar37;
  long lVar38;
  long lVar39;
  void *pvVar40;
  void *pvVar41;
  void *pvVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  void *pvVar46;
  void *pvVar47;
  void *pvVar48;
  long lVar49;
  void *pvVar50;
  long lVar51;
  void *pvVar52;
  void *pvVar53;
  long lVar54;
  void *pvVar55;
  uint _c;
  undefined4 *puVar56;
  ulong uVar57;
  void *pvVar58;
  ulong uVar59;
  long lVar60;
  void *pvVar61;
  void *pvVar62;
  ulong uVar63;
  void *local_220;
  void *local_218;
  void *local_210;
  void *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  long local_1d0;
  long local_1c8;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  int iVar35;
  
  if ((this->super_LSTM).int8_scale_term == 0) {
    _c = ((this->super_LSTM).direction == 2) + 1;
    uVar57 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
    iVar1 = (this->super_LSTM).hidden_size;
    iVar16 = (int)((long)((ulong)(uint)((int)uVar57 >> 0x1f) << 0x20 | uVar57 & 0xffffffff) /
                  (long)iVar1);
    iVar35 = iVar16 + 3;
    if (-1 < iVar16) {
      iVar35 = iVar16;
    }
    _w = iVar35 >> 2;
    uVar59 = 0;
    Mat::create(&this->weight_xc_data_packed,_w,iVar1 / 2 + iVar1 % 2,_c,0x20,8,(Allocator *)0x0);
    Mat::create(&this->bias_c_data_packed,(this->super_LSTM).hidden_size,1,_c,0x10,4,
                (Allocator *)0x0);
    iVar1 = (this->super_LSTM).hidden_size;
    Mat::create(&this->weight_hc_data_packed,(this->super_LSTM).num_output,iVar1 / 2 + iVar1 % 2,_c,
                0x20,8,(Allocator *)0x0);
    sVar4 = (this->super_LSTM).weight_xc_data.elemsize;
    lVar22 = (this->super_LSTM).weight_xc_data.cstep * sVar4;
    sVar5 = (this->super_LSTM).bias_c_data.elemsize;
    sVar6 = (this->super_LSTM).bias_c_data.cstep;
    sVar7 = (this->super_LSTM).weight_hc_data.elemsize;
    lVar23 = (this->super_LSTM).weight_hc_data.cstep * sVar7;
    sVar8 = (this->weight_xc_data_packed).elemsize;
    sVar9 = (this->bias_c_data_packed).cstep;
    sVar10 = (this->bias_c_data_packed).elemsize;
    sVar11 = (this->weight_hc_data_packed).elemsize;
    lVar44 = (long)(this->super_LSTM).bias_c_data.w * sVar5;
    uVar2 = (this->super_LSTM).hidden_size;
    uVar45 = (ulong)uVar2;
    uVar24 = (ulong)(uVar2 * 3);
    lVar54 = (long)(this->super_LSTM).weight_xc_data.w * sVar4;
    lVar39 = (this->weight_xc_data_packed).cstep * sVar8;
    lVar51 = (long)(this->weight_xc_data_packed).w * sVar8;
    lVar49 = (long)(this->super_LSTM).weight_hc_data.w * sVar7;
    lVar28 = (this->weight_hc_data_packed).cstep * sVar11;
    lVar60 = (long)(this->weight_hc_data_packed).w * sVar11;
    pvVar32 = (this->super_LSTM).weight_xc_data.data;
    pvVar25 = (void *)(lVar54 * (uVar24 + 1) + (long)pvVar32);
    uVar57 = (ulong)(uVar2 * 2);
    local_1f0 = (void *)(lVar54 * (uVar57 + 1) + (long)pvVar32);
    local_200 = (void *)(lVar54 * (uVar45 + 1) + (long)pvVar32);
    pvVar36 = (void *)(lVar54 * uVar24 + (long)pvVar32);
    local_1e8 = (void *)(lVar54 * uVar57 + (long)pvVar32);
    local_208 = (void *)(lVar54 * uVar45 + (long)pvVar32);
    pvVar53 = (this->super_LSTM).weight_hc_data.data;
    pvVar33 = (void *)((uVar24 + 1) * lVar49 + (long)pvVar53);
    pvVar46 = (void *)((uVar57 + 1) * lVar49 + (long)pvVar53);
    local_1f8 = (void *)((uVar45 + 1) * lVar49 + (long)pvVar53);
    pvVar40 = (void *)(lVar49 * uVar24 + (long)pvVar53);
    pvVar61 = (void *)(lVar49 * uVar57 + (long)pvVar53);
    pvVar42 = (void *)(lVar49 * uVar45 + (long)pvVar53);
    uVar3 = (this->super_LSTM).num_output;
    pvVar12 = (this->super_LSTM).bias_c_data.data;
    local_210 = (this->weight_xc_data_packed).data;
    pvVar13 = (this->bias_c_data_packed).data;
    pvVar48 = (this->weight_hc_data_packed).data;
    lVar17 = lVar54 * 2;
    local_218 = (void *)((long)pvVar32 + lVar54);
    lVar18 = lVar49 * 2;
    local_220 = (void *)((long)pvVar53 + lVar49);
    local_1d0 = (long)local_210 + 8;
    local_1c8 = (long)pvVar48 + 8;
    do {
      lVar26 = sVar6 * sVar5 * uVar59;
      puVar56 = (undefined4 *)(sVar9 * sVar10 * uVar59 + (long)pvVar13);
      lVar19 = lVar44 + lVar26;
      lVar20 = lVar44 * 2 + lVar26;
      lVar21 = lVar44 * 3 + lVar26;
      if ((int)uVar2 < 2) {
        uVar57 = 0;
      }
      else {
        local_160 = local_208;
        local_168 = local_218;
        local_178 = local_1f0;
        uVar24 = 0;
        pvVar27 = local_210;
        pvVar29 = pvVar61;
        pvVar30 = local_1e8;
        pvVar37 = pvVar36;
        pvVar41 = local_220;
        pvVar47 = pvVar48;
        pvVar50 = pvVar33;
        pvVar52 = pvVar53;
        pvVar55 = local_200;
        pvVar58 = pvVar46;
        pvVar62 = local_1f8;
        local_188 = pvVar25;
        local_180 = pvVar40;
        local_170 = pvVar42;
        local_158 = pvVar32;
        do {
          *puVar56 = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar26);
          puVar56[1] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar19);
          puVar56[2] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar20);
          puVar56[3] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar21);
          puVar56[4] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar26 + 4);
          puVar56[5] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar19 + 4);
          puVar56[6] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar20 + 4);
          puVar56[7] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar21 + 4);
          if (3 < iVar16) {
            lVar34 = 0;
            uVar57 = (ulong)_w;
            do {
              *(undefined4 *)((long)pvVar27 + lVar34 * 8) =
                   *(undefined4 *)((long)local_158 + lVar34);
              *(undefined4 *)((long)pvVar27 + lVar34 * 8 + 4) =
                   *(undefined4 *)((long)local_160 + lVar34);
              *(undefined4 *)((long)pvVar27 + lVar34 * 8 + 8) =
                   *(undefined4 *)((long)pvVar30 + lVar34);
              *(undefined4 *)((long)pvVar27 + lVar34 * 8 + 0xc) =
                   *(undefined4 *)((long)pvVar37 + lVar34);
              *(undefined4 *)((long)pvVar27 + lVar34 * 8 + 0x10) =
                   *(undefined4 *)((long)local_168 + lVar34);
              *(undefined4 *)((long)pvVar27 + lVar34 * 8 + 0x14) =
                   *(undefined4 *)((long)pvVar55 + lVar34);
              *(undefined4 *)((long)pvVar27 + lVar34 * 8 + 0x18) =
                   *(undefined4 *)((long)local_178 + lVar34);
              *(undefined4 *)((long)pvVar27 + lVar34 * 8 + 0x1c) =
                   *(undefined4 *)((long)local_188 + lVar34);
              lVar34 = lVar34 + 4;
              uVar57 = uVar57 - 1;
            } while (uVar57 != 0);
          }
          if (0 < (int)uVar3) {
            lVar34 = 0;
            do {
              *(undefined4 *)((long)pvVar47 + lVar34 * 8) = *(undefined4 *)((long)pvVar52 + lVar34);
              *(undefined4 *)((long)pvVar47 + lVar34 * 8 + 4) =
                   *(undefined4 *)((long)local_170 + lVar34);
              *(undefined4 *)((long)pvVar47 + lVar34 * 8 + 8) =
                   *(undefined4 *)((long)pvVar29 + lVar34);
              *(undefined4 *)((long)pvVar47 + lVar34 * 8 + 0xc) =
                   *(undefined4 *)((long)local_180 + lVar34);
              *(undefined4 *)((long)pvVar47 + lVar34 * 8 + 0x10) =
                   *(undefined4 *)((long)pvVar41 + lVar34);
              *(undefined4 *)((long)pvVar47 + lVar34 * 8 + 0x14) =
                   *(undefined4 *)((long)pvVar62 + lVar34);
              *(undefined4 *)((long)pvVar47 + lVar34 * 8 + 0x18) =
                   *(undefined4 *)((long)pvVar58 + lVar34);
              *(undefined4 *)((long)pvVar47 + lVar34 * 8 + 0x1c) =
                   *(undefined4 *)((long)pvVar50 + lVar34);
              lVar34 = lVar34 + 4;
            } while ((ulong)uVar3 << 2 != lVar34);
          }
          puVar56 = puVar56 + 8;
          uVar57 = uVar24 + 2;
          lVar34 = uVar24 + 3;
          local_188 = (void *)((long)local_188 + lVar17);
          local_178 = (void *)((long)local_178 + lVar17);
          pvVar55 = (void *)((long)pvVar55 + lVar17);
          local_168 = (void *)((long)local_168 + lVar17);
          pvVar37 = (void *)((long)pvVar37 + lVar17);
          pvVar30 = (void *)((long)pvVar30 + lVar17);
          local_160 = (void *)((long)local_160 + lVar17);
          local_158 = (void *)((long)local_158 + lVar17);
          pvVar27 = (void *)((long)pvVar27 + lVar51);
          pvVar50 = (void *)((long)pvVar50 + lVar18);
          pvVar58 = (void *)((long)pvVar58 + lVar18);
          pvVar62 = (void *)((long)pvVar62 + lVar18);
          pvVar41 = (void *)((long)pvVar41 + lVar18);
          local_180 = (void *)((long)local_180 + lVar18);
          pvVar29 = (void *)((long)pvVar29 + lVar18);
          local_170 = (void *)((long)local_170 + lVar18);
          pvVar52 = (void *)((long)pvVar52 + lVar18);
          pvVar47 = (void *)((long)pvVar47 + lVar60);
          uVar24 = uVar57;
        } while (lVar34 < (int)uVar2);
      }
      if ((int)uVar57 < (int)uVar2) {
        uVar24 = uVar57 & 0xffffffff;
        lVar34 = (long)(int)(uVar2 * 3) + uVar24;
        pvVar29 = (void *)(lVar54 * lVar34 + (long)pvVar32);
        lVar38 = (long)(int)(uVar2 * 2) + uVar24;
        pvVar37 = (void *)(lVar54 * lVar38 + (long)pvVar32);
        lVar43 = (long)(int)uVar2 + uVar24;
        pvVar47 = (void *)(lVar54 * lVar43 + (long)pvVar32);
        pvVar50 = (void *)(lVar54 * uVar24 + (long)pvVar32);
        pvVar27 = (void *)(lVar34 * lVar49 + (long)pvVar53);
        pvVar30 = (void *)(lVar38 * lVar49 + (long)pvVar53);
        pvVar41 = (void *)(lVar43 * lVar49 + (long)pvVar53);
        pvVar52 = (void *)(lVar49 * uVar24 + (long)pvVar53);
        do {
          uVar31 = (ulong)(((uint)uVar57 & 1) + ((uint)(uVar57 >> 1) & 0x7fffffff));
          *puVar56 = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar26);
          puVar56[1] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar19);
          puVar56[2] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar20);
          puVar56[3] = *(undefined4 *)((long)pvVar12 + uVar24 * 4 + lVar21);
          if (3 < iVar16) {
            lVar38 = lVar51 * uVar31 + local_1d0;
            lVar34 = 0;
            uVar63 = (ulong)_w;
            do {
              *(undefined4 *)(lVar38 + -8 + lVar34 * 4) = *(undefined4 *)((long)pvVar50 + lVar34);
              *(undefined4 *)(lVar38 + -4 + lVar34 * 4) = *(undefined4 *)((long)pvVar47 + lVar34);
              *(undefined4 *)(lVar38 + lVar34 * 4) = *(undefined4 *)((long)pvVar37 + lVar34);
              *(undefined4 *)(lVar38 + 4 + lVar34 * 4) = *(undefined4 *)((long)pvVar29 + lVar34);
              lVar34 = lVar34 + 4;
              uVar63 = uVar63 - 1;
            } while (uVar63 != 0);
          }
          if (0 < (int)uVar3) {
            lVar34 = uVar31 * lVar60 + local_1c8;
            lVar38 = 0;
            do {
              *(undefined4 *)(lVar34 + -8 + lVar38 * 4) = *(undefined4 *)((long)pvVar52 + lVar38);
              *(undefined4 *)(lVar34 + -4 + lVar38 * 4) = *(undefined4 *)((long)pvVar41 + lVar38);
              *(undefined4 *)(lVar34 + lVar38 * 4) = *(undefined4 *)((long)pvVar30 + lVar38);
              *(undefined4 *)(lVar34 + 4 + lVar38 * 4) = *(undefined4 *)((long)pvVar27 + lVar38);
              lVar38 = lVar38 + 4;
            } while ((ulong)uVar3 << 2 != lVar38);
          }
          puVar56 = puVar56 + 4;
          uVar24 = uVar24 + 1;
          pvVar29 = (void *)((long)pvVar29 + lVar54);
          pvVar37 = (void *)((long)pvVar37 + lVar54);
          pvVar47 = (void *)((long)pvVar47 + lVar54);
          pvVar50 = (void *)((long)pvVar50 + lVar54);
          uVar57 = (ulong)((uint)uVar57 + 1);
          pvVar27 = (void *)((long)pvVar27 + lVar49);
          pvVar30 = (void *)((long)pvVar30 + lVar49);
          pvVar41 = (void *)((long)pvVar41 + lVar49);
          pvVar52 = (void *)((long)pvVar52 + lVar49);
        } while (uVar24 != uVar45);
      }
      uVar59 = uVar59 + 1;
      pvVar25 = (void *)((long)pvVar25 + lVar22);
      local_1f0 = (void *)((long)local_1f0 + lVar22);
      local_200 = (void *)((long)local_200 + lVar22);
      local_218 = (void *)((long)local_218 + lVar22);
      pvVar36 = (void *)((long)pvVar36 + lVar22);
      local_1e8 = (void *)((long)local_1e8 + lVar22);
      local_208 = (void *)((long)local_208 + lVar22);
      pvVar32 = (void *)((long)pvVar32 + lVar22);
      local_210 = (void *)((long)local_210 + lVar39);
      pvVar33 = (void *)((long)pvVar33 + lVar23);
      pvVar46 = (void *)((long)pvVar46 + lVar23);
      local_1f8 = (void *)((long)local_1f8 + lVar23);
      local_220 = (void *)((long)local_220 + lVar23);
      pvVar40 = (void *)((long)pvVar40 + lVar23);
      pvVar61 = (void *)((long)pvVar61 + lVar23);
      pvVar42 = (void *)((long)pvVar42 + lVar23);
      pvVar53 = (void *)((long)pvVar53 + lVar23);
      pvVar48 = (void *)((long)pvVar48 + lVar28);
      local_1d0 = local_1d0 + lVar39;
      local_1c8 = local_1c8 + lVar28;
    } while (uVar59 != _c);
    if (opt->lightmode != false) {
      piVar14 = (this->super_LSTM).weight_xc_data.refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar32 = (this->super_LSTM).weight_xc_data.data;
          pAVar15 = (this->super_LSTM).weight_xc_data.allocator;
          if (pAVar15 == (Allocator *)0x0) {
            if (pvVar32 != (void *)0x0) {
              free(pvVar32);
            }
          }
          else {
            (*pAVar15->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_xc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_xc_data.data = (void *)0x0;
      (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_xc_data.dims = 0;
      (this->super_LSTM).weight_xc_data.w = 0;
      (this->super_LSTM).weight_xc_data.h = 0;
      (this->super_LSTM).weight_xc_data.d = 0;
      (this->super_LSTM).weight_xc_data.c = 0;
      piVar14 = (this->super_LSTM).bias_c_data.refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar32 = (this->super_LSTM).bias_c_data.data;
          pAVar15 = (this->super_LSTM).bias_c_data.allocator;
          if (pAVar15 == (Allocator *)0x0) {
            if (pvVar32 != (void *)0x0) {
              free(pvVar32);
            }
          }
          else {
            (*pAVar15->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).bias_c_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
      (this->super_LSTM).bias_c_data.data = (void *)0x0;
      (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
      (this->super_LSTM).bias_c_data.dims = 0;
      (this->super_LSTM).bias_c_data.w = 0;
      (this->super_LSTM).bias_c_data.h = 0;
      (this->super_LSTM).bias_c_data.d = 0;
      (this->super_LSTM).bias_c_data.c = 0;
      piVar14 = (this->super_LSTM).weight_hc_data.refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar32 = (this->super_LSTM).weight_hc_data.data;
          pAVar15 = (this->super_LSTM).weight_hc_data.allocator;
          if (pAVar15 == (Allocator *)0x0) {
            if (pvVar32 != (void *)0x0) {
              free(pvVar32);
            }
          }
          else {
            (*pAVar15->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_hc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_hc_data.data = (void *)0x0;
      (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_hc_data.dims = 0;
      (this->super_LSTM).weight_hc_data.w = 0;
      (this->super_LSTM).weight_hc_data.h = 0;
      (this->super_LSTM).weight_hc_data.d = 0;
      (this->super_LSTM).weight_hc_data.c = 0;
    }
  }
  else {
    create_pipeline_int8(this,opt);
  }
  return 0;
}

Assistant:

int LSTM_x86_avx::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}